

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)11,(moira::Size)1>(Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  u32 uVar5;
  int iVar6;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar2 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  iVar6 = (uVar2 & 0xff) - (uVar1 & 0xff);
  (this->reg).sr.c = (bool)((byte)((uint)iVar6 >> 8) & 1);
  bVar4 = (byte)uVar2;
  bVar3 = (byte)iVar6;
  (this->reg).sr.v = (bool)((byte)((bVar3 ^ bVar4) & ((byte)uVar1 ^ bVar4)) >> 7);
  (this->reg).sr.z = bVar3 == 0;
  (this->reg).sr.n = (bool)(bVar3 >> 7);
  uVar5 = (this->reg).pc;
  (this->reg).pc0 = uVar5;
  (this->queue).ird = (this->queue).irc;
  uVar5 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar5 + 2);
  (this->queue).irc = (u16)uVar5;
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}